

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_random_ctr_drbg.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  FILE *__s;
  char *__format;
  int iVar2;
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_entropy_context entropy;
  uchar buf [1024];
  mbedtls_ctr_drbg_context local_990;
  mbedtls_entropy_context local_838;
  uchar local_438 [1032];
  
  mbedtls_ctr_drbg_init(&local_990);
  if (argc < 2) {
    main_cold_1();
    return 1;
  }
  __s = fopen(argv[1],"wb+");
  if (__s == (FILE *)0x0) {
    printf("failed to open \'%s\' for writing.\n",argv[1]);
    return 1;
  }
  mbedtls_entropy_init(&local_838);
  uVar1 = mbedtls_ctr_drbg_seed(&local_990,mbedtls_entropy_func,&local_838,(uchar *)"RANDOM_GEN",10)
  ;
  if (uVar1 == 0) {
    mbedtls_ctr_drbg_set_prediction_resistance(&local_990,0);
    uVar1 = mbedtls_ctr_drbg_update_seed_file(&local_990,"seedfile");
    if (uVar1 == 0) {
LAB_00102405:
      iVar2 = uVar1 + 1;
      do {
        uVar1 = mbedtls_ctr_drbg_random(&local_990,local_438,0x400);
        if (uVar1 != 0) {
          puts("failed!");
          goto LAB_00102336;
        }
        fwrite(local_438,1,0x400,__s);
        printf("Generating %ldkb of data in file \'%s\'... %04.1f%% done\r",
               (double)(((float)iVar2 * 100.0) / 768.0),0x300,argv[1]);
        fflush(_stdout);
        iVar2 = iVar2 + 1;
      } while (iVar2 != 0x301);
      uVar1 = 0;
      goto LAB_00102336;
    }
    if (uVar1 == 0xffffffc6) {
      puts("Failed to open seedfile. Generating one.");
      uVar1 = mbedtls_ctr_drbg_write_seed_file(&local_990,"seedfile");
      if (uVar1 == 0) {
        uVar1 = 0;
        goto LAB_00102405;
      }
      __format = "failed in mbedtls_ctr_drbg_write_seed_file: %d\n";
    }
    else {
      __format = "failed in mbedtls_ctr_drbg_update_seed_file: %d\n";
    }
  }
  else {
    __format = "failed in mbedtls_ctr_drbg_seed: %d\n";
  }
  printf(__format,(ulong)uVar1);
LAB_00102336:
  putchar(10);
  fclose(__s);
  mbedtls_ctr_drbg_free(&local_990);
  mbedtls_entropy_free(&local_838);
  return uVar1;
}

Assistant:

int main( int argc, char *argv[] )
{
    FILE *f;
    int i, k, ret;
    mbedtls_ctr_drbg_context ctr_drbg;
    mbedtls_entropy_context entropy;
    unsigned char buf[1024];

    mbedtls_ctr_drbg_init( &ctr_drbg );

    if( argc < 2 )
    {
        mbedtls_fprintf( stderr, "usage: %s <output filename>\n", argv[0] );
        return( 1 );
    }

    if( ( f = fopen( argv[1], "wb+" ) ) == NULL )
    {
        mbedtls_printf( "failed to open '%s' for writing.\n", argv[1] );
        return( 1 );
    }

    mbedtls_entropy_init( &entropy );
    ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy, (const unsigned char *) "RANDOM_GEN", 10 );
    if( ret != 0 )
    {
        mbedtls_printf( "failed in mbedtls_ctr_drbg_seed: %d\n", ret );
        goto cleanup;
    }
    mbedtls_ctr_drbg_set_prediction_resistance( &ctr_drbg, MBEDTLS_CTR_DRBG_PR_OFF );

#if defined(MBEDTLS_FS_IO)
    ret = mbedtls_ctr_drbg_update_seed_file( &ctr_drbg, "seedfile" );

    if( ret == MBEDTLS_ERR_CTR_DRBG_FILE_IO_ERROR )
    {
        mbedtls_printf( "Failed to open seedfile. Generating one.\n" );
        ret = mbedtls_ctr_drbg_write_seed_file( &ctr_drbg, "seedfile" );
        if( ret != 0 )
        {
            mbedtls_printf( "failed in mbedtls_ctr_drbg_write_seed_file: %d\n", ret );
            goto cleanup;
        }
    }
    else if( ret != 0 )
    {
        mbedtls_printf( "failed in mbedtls_ctr_drbg_update_seed_file: %d\n", ret );
        goto cleanup;
    }
#endif

    for( i = 0, k = 768; i < k; i++ )
    {
        ret = mbedtls_ctr_drbg_random( &ctr_drbg, buf, sizeof( buf ) );
        if( ret != 0 )
        {
            mbedtls_printf("failed!\n");
            goto cleanup;
        }

        fwrite( buf, 1, sizeof( buf ), f );

        mbedtls_printf( "Generating %ldkb of data in file '%s'... %04.1f" \
                "%% done\r", (long)(sizeof(buf) * k / 1024), argv[1], (100 * (float) (i + 1)) / k );
        fflush( stdout );
    }

    ret = 0;

cleanup:
    mbedtls_printf("\n");

    fclose( f );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

    return( ret );
}